

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall
crnlib::crn_comp::optimize_color_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  vector<unsigned_short> *this_00;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  unsigned_short *puVar4;
  level_details *plVar5;
  endpoint_indices_details *peVar6;
  uint *puVar7;
  uint8 *puVar8;
  uint local_1ac;
  undefined1 local_150 [8];
  symbol_codec codec;
  uint16 s;
  uint8 *code_sizes;
  static_huffman_data_model dm;
  int sym;
  uint index;
  uint bEnd;
  uint b;
  uint endpoint_index;
  uint local_4c;
  undefined1 local_48 [4];
  uint level;
  vector<unsigned_int> hist;
  uint total_bits;
  uint16 n;
  vector<unsigned_short> *remapping;
  optimize_color_params *pParams;
  void *pData_ptr_local;
  uint64 data_local;
  crn_comp *this_local;
  
  this_00 = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  hist.m_capacity._2_2_ = *(ushort *)((long)pData_ptr + 0x10);
  vector<unsigned_short>::resize(this_00,(uint)(ushort)hist.m_capacity._2_2_,false);
  if (data == 0) {
    sort_color_endpoints(this_00,*pData_ptr,hist.m_capacity._2_2_);
    optimize_color_selectors(this);
  }
  else {
    puVar4 = vector<unsigned_short>::get_ptr(this_00);
    remap_color_endpoints
              (puVar4,*pData_ptr,*(uint **)((long)pData_ptr + 8),hist.m_capacity._2_2_,
               *(uint16 *)((long)pData_ptr + 0x12),*(float *)((long)pData_ptr + 0x14));
  }
  if ((this->m_has_etc_color_blocks & 1U) == 0) {
    pack_color_endpoints
              (this,(vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10),this_00);
  }
  else {
    pack_color_endpoints_etc
              (this,(vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10),this_00);
  }
  uVar2 = vector<unsigned_char>::size
                    ((vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10));
  hist.m_size = uVar2 << 3;
  vector<unsigned_int>::vector((vector<unsigned_int> *)local_48,(uint)(ushort)hist.m_capacity._2_2_)
  ;
  for (local_4c = 0; uVar2 = vector<crnlib::crn_comp::level_details>::size(&this->m_levels),
      local_4c < uVar2; local_4c = local_4c + 1) {
    bEnd = 0;
    plVar5 = vector<crnlib::crn_comp::level_details>::operator[](&this->m_levels,local_4c);
    index = plVar5->first_block;
    plVar5 = vector<crnlib::crn_comp::level_details>::operator[](&this->m_levels,local_4c);
    uVar3 = index + plVar5->num_blocks;
    for (; index < uVar3; index = index + 1) {
      peVar6 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                         (&this->m_endpoint_indices,index);
      puVar4 = vector<unsigned_short>::operator[](this_00,(uint)(peVar6->field_0).field_0.color);
      dm._52_4_ = ZEXT24(*puVar4);
      if (((this->m_has_subblocks & 1U) == 0) || ((index & 1) == 0)) {
        peVar6 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                           (&this->m_endpoint_indices,index);
        bVar1 = (peVar6->reference != '\0' ^ 0xffU) & 1;
      }
      else {
        peVar6 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                           (&this->m_endpoint_indices,index);
        bVar1 = peVar6->reference;
      }
      if (bVar1 != 0) {
        dm._48_4_ = dm._52_4_ - bEnd;
        local_1ac = dm._48_4_;
        if ((int)dm._48_4_ < 0) {
          local_1ac = dm._48_4_ + (uint)(ushort)hist.m_capacity._2_2_;
        }
        puVar7 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_48,local_1ac);
        *puVar7 = *puVar7 + 1;
      }
      bEnd = dm._52_4_;
    }
  }
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)&code_sizes);
  vector<unsigned_int>::get_ptr((vector<unsigned_int> *)local_48);
  static_huffman_data_model::init((static_huffman_data_model *)&code_sizes,(EVP_PKEY_CTX *)0x1);
  puVar8 = static_huffman_data_model::get_code_sizes((static_huffman_data_model *)&code_sizes);
  for (codec.m_mode._2_2_ = cNull >> 0x10;
      (ushort)codec.m_mode._2_2_ < (ushort)hist.m_capacity._2_2_;
      codec.m_mode._2_2_ = codec.m_mode._2_2_ + 1) {
    puVar7 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)local_48,(uint)(ushort)codec.m_mode._2_2_);
    hist.m_size = *puVar7 * (uint)puVar8[(ushort)codec.m_mode._2_2_] + hist.m_size;
  }
  symbol_codec::symbol_codec((symbol_codec *)local_150);
  symbol_codec::start_encoding((symbol_codec *)local_150,0x10000);
  symbol_codec::encode_enable_simulation((symbol_codec *)local_150,true);
  symbol_codec::encode_transmit_static_huffman_data_model
            ((symbol_codec *)local_150,(static_huffman_data_model *)&code_sizes,false,
             (static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding((symbol_codec *)local_150,false);
  uVar2 = symbol_codec::encode_get_total_bits_written((symbol_codec *)local_150);
  hist.m_size = hist.m_size + uVar2;
  *(uint *)(*(long *)((long)pData_ptr + 0x18) + 0x20) = hist.m_size;
  crnlib_delete<crnlib::optimize_color_params>((optimize_color_params *)pData_ptr);
  symbol_codec::~symbol_codec((symbol_codec *)local_150);
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)&code_sizes);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)local_48);
  return;
}

Assistant:

void crn_comp::optimize_color_endpoints_task(uint64 data, void* pData_ptr) {
  optimize_color_params* pParams = reinterpret_cast<optimize_color_params*>(pData_ptr);
  crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
  uint16 n = pParams->n;
  remapping.resize(n);

  if (data) {
    remap_color_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
  } else {
    sort_color_endpoints(remapping, pParams->unpacked_endpoints, n);
    optimize_color_selectors();
  }

  m_has_etc_color_blocks ? pack_color_endpoints_etc(pParams->pResult->packed_endpoints, remapping) : pack_color_endpoints(pParams->pResult->packed_endpoints, remapping);
  uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

  crnlib::vector<uint> hist(n);
  for (uint level = 0; level < m_levels.size(); level++) {
    for (uint endpoint_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++) {
      uint index = remapping[m_endpoint_indices[b].component[cColor]];
      if (m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference) {
        int sym = index - endpoint_index;
        hist[sym < 0 ? sym + n : sym]++;
      }
      endpoint_index = index;
    }
  }

  static_huffman_data_model dm;
  dm.init(true, n, hist.get_ptr(), 16);
  const uint8* code_sizes = dm.get_code_sizes();
  for (uint16 s = 0; s < n; s++)
    total_bits += hist[s] * code_sizes[s];

  symbol_codec codec;
  codec.start_encoding(64 * 1024);
  codec.encode_enable_simulation(true);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  codec.stop_encoding(false);
  total_bits += codec.encode_get_total_bits_written();

  pParams->pResult->total_bits = total_bits;

  crnlib_delete(pParams);
}